

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

void Diligent::PrintShaderCodeVariables
               (stringstream *ss,size_t LevelIdent,size_t IdentShift,ShaderCodeVariableDesc *pVars,
               Uint32 NumVars)

{
  ostream *poVar1;
  bool bVar2;
  size_t LevelIdent_00;
  ShaderCodeVariableDesc *pSVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  char *pcVar7;
  ostream *poVar8;
  int iVar9;
  uint uVar10;
  Uint32 UVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  stringstream *ss_00;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  char local_95 [5];
  ulong local_90;
  ulong local_88;
  ulong local_80;
  size_t local_78;
  ShaderCodeVariableDesc *local_70;
  ulong local_68;
  stringstream *local_60;
  size_t local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  if (NumVars != 0 && pVars != (ShaderCodeVariableDesc *)0x0) {
    local_68 = (ulong)NumVars;
    uVar15 = 0;
    local_88 = 0;
    local_90 = local_90 & 0xffffffff00000000;
    local_80 = local_80 & 0xffffffff00000000;
    uVar13 = 0;
    uVar14 = 0;
    uVar16 = 0;
    local_78 = LevelIdent;
    local_70 = pVars;
    local_60 = ss;
    local_58 = IdentShift;
    do {
      if (local_70[uVar15].Name != (char *)0x0) {
        uVar5 = strlen(local_70[uVar15].Name);
        if ((int)uVar5 < (int)local_88) {
          uVar5 = local_88;
        }
        local_88 = uVar5 & 0xffffffff;
      }
      pSVar3 = local_70;
      if (local_70[uVar15].TypeName != (char *)0x0) {
        sVar6 = strlen(local_70[uVar15].TypeName);
        iVar9 = (int)sVar6;
        if ((int)sVar6 < (int)local_90) {
          iVar9 = (int)local_90;
        }
        local_90 = CONCAT44(local_90._4_4_,iVar9);
      }
      uVar4 = 1;
      iVar9 = 1;
      if (pSVar3[uVar15].ArraySize != 0) {
        iVar9 = 0;
        UVar11 = pSVar3[uVar15].ArraySize;
        do {
          iVar9 = iVar9 + 1;
          bVar2 = 9 < UVar11;
          UVar11 = UVar11 / 10;
        } while (bVar2);
      }
      iVar12 = (int)local_80;
      if ((int)local_80 <= iVar9) {
        iVar12 = iVar9;
      }
      local_80 = CONCAT44(local_80._4_4_,iVar12);
      if (pSVar3[uVar15].Offset != 0) {
        uVar4 = 0;
        uVar10 = pSVar3[uVar15].Offset;
        do {
          uVar4 = uVar4 + 1;
          bVar2 = 9 < uVar10;
          uVar10 = uVar10 / 10;
        } while (bVar2);
      }
      if ((int)uVar13 <= (int)uVar4) {
        uVar13 = uVar4;
      }
      pcVar7 = GetShaderCodeVariableClassString(pSVar3[uVar15].Class);
      sVar6 = strlen(pcVar7);
      if ((int)uVar14 <= (int)(uint)sVar6) {
        uVar14 = (uint)sVar6;
      }
      pcVar7 = GetShaderCodeBasicTypeString(pSVar3[uVar15].BasicType);
      sVar6 = strlen(pcVar7);
      pSVar3 = local_70;
      if ((int)uVar16 <= (int)(uint)sVar6) {
        uVar16 = (uint)sVar6;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != local_68);
    poVar1 = (ostream *)(local_60 + 0x10);
    local_38 = (long)((int)local_88 + (int)local_78);
    local_90 = local_90 & 0xffffffff;
    local_40 = (ulong)uVar14;
    local_48 = (ulong)uVar16;
    local_80 = local_80 & 0xffffffff;
    local_50 = (ulong)uVar13;
    local_78 = local_78 + local_58 + (local_88 & 0xffffffff);
    local_88 = local_68 * 0x28;
    lVar17 = 0;
    ss_00 = local_60;
    do {
      *(long *)(ss_00 + *(long *)(*(long *)(ss_00 + 0x10) + -0x18) + 0x20) = local_38;
      pcVar7 = *(char **)((long)&pSVar3->Name + lVar17);
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "?";
      }
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar7,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
      *(ulong *)(ss_00 + *(long *)(*(long *)(ss_00 + 0x10) + -0x18) + 0x20) = local_90;
      pcVar7 = *(char **)((long)&pSVar3->TypeName + lVar17);
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "";
      }
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar7,sVar6);
      local_95[0] = ' ';
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_95,1);
      *(ulong *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = local_40;
      pcVar7 = GetShaderCodeVariableClassString((&pSVar3->Class)[lVar17]);
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar6);
      local_95[1] = 0x20;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_95 + 1,1);
      *(ulong *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = local_48;
      pcVar7 = GetShaderCodeBasicTypeString((&pSVar3->BasicType)[lVar17]);
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar6);
      local_95[2] = 0x20;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_95 + 2,1);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      local_95[3] = 0x78;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_95 + 3,1);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
      *(ulong *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = local_80;
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      local_95[4] = 0x5d;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_95 + 4,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," offset: ",9);
      *(ulong *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = local_50;
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      ss_00 = local_60;
      LevelIdent_00 = local_78;
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      PrintShaderCodeVariables
                (ss_00,LevelIdent_00,local_58,
                 *(ShaderCodeVariableDesc **)((long)&pSVar3->pMembers + lVar17),
                 *(Uint32 *)((long)&pSVar3->NumMembers + lVar17));
      lVar17 = lVar17 + 0x28;
    } while (local_88 != lVar17);
  }
  return;
}

Assistant:

static void PrintShaderCodeVariables(std::stringstream& ss, size_t LevelIdent, size_t IdentShift, const ShaderCodeVariableDesc* pVars, Uint32 NumVars)
{
    if (pVars == nullptr || NumVars == 0)
        return;

    int MaxNameLen      = 0;
    int MaxTypeLen      = 0;
    int MaxArraySizeLen = 0;
    int MaxOffsetLen    = 0;
    int MaxClassLen     = 0;
    int MaxBasicTypeLen = 0;
    for (Uint32 i = 0; i < NumVars; ++i)
    {
        const ShaderCodeVariableDesc& Var = pVars[i];
        if (Var.Name != nullptr)
            MaxNameLen = std::max(MaxNameLen, static_cast<int>(strlen(Var.Name)));
        if (Var.TypeName != nullptr)
            MaxTypeLen = std::max(MaxTypeLen, static_cast<int>(strlen(Var.TypeName)));
        MaxArraySizeLen = std::max(MaxArraySizeLen, static_cast<int>(GetPrintWidth(Var.ArraySize)));
        MaxOffsetLen    = std::max(MaxOffsetLen, static_cast<int>(GetPrintWidth(Var.Offset)));
        MaxClassLen     = std::max(MaxClassLen, static_cast<int>(strlen(GetShaderCodeVariableClassString(Var.Class))));
        MaxBasicTypeLen = std::max(MaxBasicTypeLen, static_cast<int>(strlen(GetShaderCodeBasicTypeString(Var.BasicType))));
    }

    for (Uint32 i = 0; i < NumVars; ++i)
    {
        const ShaderCodeVariableDesc& Var = pVars[i];
        ss << std::setw(static_cast<int>(LevelIdent) + MaxNameLen) << (Var.Name ? Var.Name : "?")
           << ": " << std::setw(MaxTypeLen) << (Var.TypeName ? Var.TypeName : "")
           << ' ' << std::setw(MaxClassLen) << GetShaderCodeVariableClassString(Var.Class)
           << ' ' << std::setw(MaxBasicTypeLen) << GetShaderCodeBasicTypeString(Var.BasicType)
           << ' ' << Uint32{Var.NumRows} << 'x' << Uint32{Var.NumColumns} << " [" << std::setw(MaxArraySizeLen) << Var.ArraySize << ']'
           << " offset: " << std::setw(MaxOffsetLen) << Var.Offset << std::endl;

        PrintShaderCodeVariables(ss, LevelIdent + MaxNameLen + IdentShift, IdentShift, Var.pMembers, Var.NumMembers);
    }
}